

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderPushData(xmlTextReaderPtr reader)

{
  xmlTextReaderState xVar1;
  uint uVar2;
  xmlBufPtr buf;
  xmlParserCtxtPtr pxVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  xmlTextReaderState oldstate;
  int s;
  int val;
  xmlBufPtr inbuf;
  xmlTextReaderPtr reader_local;
  
  if ((reader->input == (xmlParserInputBufferPtr)0x0) || (reader->input->buffer == (xmlBufPtr)0x0))
  {
    reader_local._4_4_ = -1;
  }
  else {
    xVar1 = reader->state;
    reader->state = XML_TEXTREADER_NONE;
    buf = reader->input->buffer;
    while (reader->state == XML_TEXTREADER_NONE) {
      sVar6 = xmlBufUse(buf);
      if (sVar6 < reader->cur + 0x200) {
        if (reader->mode == 3) break;
        iVar4 = xmlParserInputBufferRead(reader->input,0x1000);
        if (iVar4 == 0) {
          sVar6 = xmlBufUse(buf);
          if (sVar6 == reader->cur) {
            reader->mode = 3;
            break;
          }
        }
        else if (iVar4 < 0) {
          xmlCtxtErrIO(reader->ctxt,reader->input->error,(char *)0x0);
          reader->mode = 2;
          reader->state = XML_TEXTREADER_ERROR;
          return -1;
        }
      }
      sVar6 = xmlBufUse(buf);
      if (sVar6 < reader->cur + 0x200) {
        sVar6 = xmlBufUse(buf);
        iVar4 = (int)sVar6 - reader->cur;
        pxVar3 = reader->ctxt;
        pxVar7 = xmlBufContent(buf);
        iVar5 = xmlParseChunk(pxVar3,(char *)(pxVar7 + reader->cur),iVar4,0);
        reader->cur = iVar4 + reader->cur;
        if (iVar5 != 0) {
          reader->ctxt->wellFormed = 0;
        }
        break;
      }
      pxVar3 = reader->ctxt;
      pxVar7 = xmlBufContent(buf);
      iVar4 = xmlParseChunk(pxVar3,(char *)(pxVar7 + reader->cur),0x200,0);
      reader->cur = reader->cur + 0x200;
      if (iVar4 != 0) {
        reader->ctxt->wellFormed = 0;
      }
      if (reader->ctxt->wellFormed == 0) break;
    }
    reader->state = xVar1;
    if (reader->mode == 1) {
      if (0x50 < reader->cur) {
        sVar6 = xmlBufShrink(buf,(ulong)(reader->cur - 0x50));
        if (-1 < (int)sVar6) {
          reader->cur = reader->cur - (int)sVar6;
        }
      }
    }
    else if ((reader->mode == 3) && (reader->state != XML_TEXTREADER_DONE)) {
      sVar6 = xmlBufUse(buf);
      uVar2 = reader->cur;
      pxVar3 = reader->ctxt;
      pxVar7 = xmlBufContent(buf);
      iVar4 = xmlParseChunk(pxVar3,(char *)(pxVar7 + reader->cur),(int)sVar6 - uVar2,1);
      sVar6 = xmlBufUse(buf);
      reader->cur = (uint)sVar6;
      reader->state = XML_TEXTREADER_DONE;
      if (iVar4 != 0) {
        if (reader->ctxt->wellFormed == 0) {
          return -1;
        }
        reader->ctxt->wellFormed = 0;
      }
    }
    if (reader->ctxt->wellFormed == 0) {
      reader->mode = 3;
      reader_local._4_4_ = -1;
    }
    else {
      reader_local._4_4_ = 0;
    }
  }
  return reader_local._4_4_;
}

Assistant:

static int
xmlTextReaderPushData(xmlTextReaderPtr reader) {
    xmlBufPtr inbuf;
    int val, s;
    xmlTextReaderState oldstate;

    if ((reader->input == NULL) || (reader->input->buffer == NULL))
	return(-1);

    oldstate = reader->state;
    reader->state = XML_TEXTREADER_NONE;
    inbuf = reader->input->buffer;

    while (reader->state == XML_TEXTREADER_NONE) {
	if (xmlBufUse(inbuf) < reader->cur + CHUNK_SIZE) {
	    /*
	     * Refill the buffer unless we are at the end of the stream
	     */
	    if (reader->mode != XML_TEXTREADER_MODE_EOF) {
		val = xmlParserInputBufferRead(reader->input, 4096);
		if (val == 0) {
		    if (xmlBufUse(inbuf) == reader->cur) {
			reader->mode = XML_TEXTREADER_MODE_EOF;
                        break;
		    }
		} else if (val < 0) {
                    xmlCtxtErrIO(reader->ctxt, reader->input->error, NULL);
                    reader->mode = XML_TEXTREADER_MODE_ERROR;
                    reader->state = XML_TEXTREADER_ERROR;
                    return(-1);
		}

	    } else
		break;
	}
	/*
	 * parse by block of CHUNK_SIZE bytes, various tests show that
	 * it's the best tradeoff at least on a 1.2GH Duron
	 */
	if (xmlBufUse(inbuf) >= reader->cur + CHUNK_SIZE) {
	    val = xmlParseChunk(reader->ctxt,
                 (const char *) xmlBufContent(inbuf) + reader->cur,
                                CHUNK_SIZE, 0);
	    reader->cur += CHUNK_SIZE;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    if (reader->ctxt->wellFormed == 0)
		break;
	} else {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 0);
	    reader->cur += s;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    break;
	}
    }
    reader->state = oldstate;

    /*
     * Discard the consumed input when needed and possible
     */
    if (reader->mode == XML_TEXTREADER_MODE_INTERACTIVE) {
        if (reader->cur > 80 /* LINE_LEN */) {
            val = xmlBufShrink(inbuf, reader->cur - 80);
            if (val >= 0) {
                reader->cur -= val;
            }
        }
    }

    /*
     * At the end of the stream signal that the work is done to the Push
     * parser.
     */
    else if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	if (reader->state != XML_TEXTREADER_DONE) {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 1);
	    reader->cur = xmlBufUse(inbuf);
	    reader->state  = XML_TEXTREADER_DONE;
	    if (val != 0) {
	        if (reader->ctxt->wellFormed)
		    reader->ctxt->wellFormed = 0;
		else
		    return(-1);
	    }
	}
    }
    if (reader->ctxt->wellFormed == 0) {
	reader->mode = XML_TEXTREADER_MODE_EOF;
        return(-1);
    }

    return(0);
}